

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedFlatImageChannel<unsigned_int>::resize(TypedFlatImageChannel<unsigned_int> *this)

{
  ulong uVar1;
  uint *__s;
  
  if (this->_pixels != (uint *)0x0) {
    operator_delete__(this->_pixels);
  }
  this->_pixels = (uint *)0x0;
  ImageChannel::resize((ImageChannel *)this);
  uVar1 = (this->super_FlatImageChannel).super_ImageChannel._numPixels;
  __s = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
  this->_pixels = __s;
  if (uVar1 != 0) {
    memset(__s,0,uVar1 * 4);
  }
  (*(this->super_FlatImageChannel).super_ImageChannel._vptr_ImageChannel[5])(this);
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete[] _pixels;
    _pixels = 0;

    FlatImageChannel::resize (); // may throw an exception

    _pixels = new T[numPixels ()];

    for (size_t i = 0; i < numPixels (); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}